

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssa_rewrite_pass.cpp
# Opt level: O0

uint32_t __thiscall
spvtools::opt::SSARewriter::GetReachingDef(SSARewriter *this,uint32_t var_id,BasicBlock *bb)

{
  uint32_t uVar1;
  CFG *pCVar2;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *this_00;
  size_type sVar3;
  const_reference pvVar4;
  BasicBlock *bb_00;
  PhiCandidate *this_01;
  PhiCandidate *phi_candidate;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *predecessors;
  uint32_t val_id;
  BasicBlock *bb_local;
  uint32_t var_id_local;
  SSARewriter *this_local;
  
  predecessors._4_4_ = GetValueAtBlock(this,var_id,bb);
  this_local._4_4_ = predecessors._4_4_;
  if (predecessors._4_4_ == 0) {
    pCVar2 = Pass::cfg(&this->pass_->super_Pass);
    uVar1 = BasicBlock::id(bb);
    this_00 = CFG::preds(pCVar2,uVar1);
    sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
    if (sVar3 == 1) {
      pCVar2 = Pass::cfg(&this->pass_->super_Pass);
      pvVar4 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[](this_00,0);
      bb_00 = CFG::block(pCVar2,*pvVar4);
      predecessors._4_4_ = GetReachingDef(this,var_id,bb_00);
    }
    else {
      sVar3 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::size(this_00);
      if (1 < sVar3) {
        this_01 = CreatePhiCandidate(this,var_id,bb);
        uVar1 = PhiCandidate::result_id(this_01);
        WriteVariable(this,var_id,bb,uVar1);
        predecessors._4_4_ = AddPhiOperands(this,this_01);
      }
    }
    if ((predecessors._4_4_ == 0) &&
       (predecessors._4_4_ = MemPass::GetUndefVal(this->pass_,var_id), predecessors._4_4_ == 0)) {
      this_local._4_4_ = 0;
    }
    else {
      WriteVariable(this,var_id,bb,predecessors._4_4_);
      this_local._4_4_ = predecessors._4_4_;
    }
  }
  return this_local._4_4_;
}

Assistant:

uint32_t SSARewriter::GetReachingDef(uint32_t var_id, BasicBlock* bb) {
  // If |var_id| has a definition in |bb|, return it.
  uint32_t val_id = GetValueAtBlock(var_id, bb);
  if (val_id != 0) return val_id;

  // Otherwise, look up the value for |var_id| in |bb|'s predecessors.
  auto& predecessors = pass_->cfg()->preds(bb->id());
  if (predecessors.size() == 1) {
    // If |bb| has exactly one predecessor, we look for |var_id|'s definition
    // there.
    val_id = GetReachingDef(var_id, pass_->cfg()->block(predecessors[0]));
  } else if (predecessors.size() > 1) {
    // If there is more than one predecessor, this is a join block which may
    // require a Phi instruction.  This will act as |var_id|'s current
    // definition to break potential cycles.
    PhiCandidate& phi_candidate = CreatePhiCandidate(var_id, bb);

    // Set the value for |bb| to avoid an infinite recursion.
    WriteVariable(var_id, bb, phi_candidate.result_id());
    val_id = AddPhiOperands(&phi_candidate);
  }

  // If we could not find a store for this variable in the path from the root
  // of the CFG, the variable is not defined, so we use undef.
  if (val_id == 0) {
    val_id = pass_->GetUndefVal(var_id);
    if (val_id == 0) {
      return 0;
    }
  }

  WriteVariable(var_id, bb, val_id);

  return val_id;
}